

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Graph.cpp
# Opt level: O1

void __thiscall Graph::auxBranchReactiveLoss(Graph *this,Vertex *v,double *sum)

{
  Edge *pEVar1;
  double dVar2;
  
  for (pEVar1 = v->edgesList; pEVar1 != (Edge *)0x0; pEVar1 = pEVar1->nextEdge) {
    if (pEVar1->closed == false) {
      pEVar1->activePowerFlow = 0.0;
      pEVar1->reactivePowerFlow = 0.0;
      pEVar1->activeLoss = 0.0;
      pEVar1->reactiveLoss = 0.0;
    }
    else {
      dVar2 = Vertex::getReactivePower(pEVar1->destiny);
      *sum = dVar2 + pEVar1->reactiveLoss + *sum;
      auxBranchReactiveLoss(this,pEVar1->destiny,sum);
    }
  }
  return;
}

Assistant:

void Graph::auxBranchReactiveLoss(Vertex *v, double &sum){
    for(Edge *e = v->getEdgesList(); e!=NULL; e = e->getNext()){

        //nao descer por arcos com chave aberta
        while(e!=NULL && e->isClosed() == false){

            //nao tem fluxo nem perda em arcos abertos
            e->setActiveFlow(0.0);
            e->setReactiveFlow(0.0);
            e->setActiveLoss(0.0);
            e->setReactiveLoss(0.0);

            e = e->getNext();
        }
        if(e==NULL)
            break;

        sum+= e->getDestiny()->getReactivePower() + e->getReactiveLoss();
        auxBranchReactiveLoss(e->getDestiny(), sum);
    }
}